

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  Env *pEVar1;
  pointer pcVar2;
  size_type *psVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  Status del;
  FileType type;
  uint64_t number;
  FileLock *lock;
  Status result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string lockname;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  char *local_e0;
  FileType local_d4;
  uint64_t local_d0;
  undefined8 local_c8;
  size_type *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar1 = options->env;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*pEVar1->_vptr_Env[7])(&local_c0,pEVar1,dbname);
  if (local_c0 == (size_type *)0x0) {
    LockFileName(&local_58,dbname);
    (*pEVar1->_vptr_Env[0xd])(&local_78,pEVar1,&local_58,&local_c8);
    psVar3 = local_c0;
    local_c0 = local_78;
    local_78 = psVar3;
    if (psVar3 != (size_type *)0x0) {
      operator_delete__(psVar3);
    }
    if (local_c0 == (size_type *)0x0) {
      if (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          bVar4 = ParseFileName((string *)
                                ((long)&((local_b8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar8),&local_d0,&local_d4);
          if (bVar4 && local_d4 != kDBLockFile) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            pcVar2 = (dbname->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar2,pcVar2 + dbname->_M_string_length);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_98,"/");
            pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_98,
                                 *(char **)((long)&((local_b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar8),
                                 *(size_type *)
                                  ((long)&(local_b8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                          _M_string_length + lVar8));
            local_78 = (size_type *)(pbVar5->_M_dataplus)._M_p;
            paVar6 = &pbVar5->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78 == paVar6) {
              local_68 = paVar6->_M_allocated_capacity;
              uStack_60 = *(undefined4 *)((long)&pbVar5->field_2 + 8);
              uStack_5c = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
              local_78 = &local_68;
            }
            else {
              local_68 = paVar6->_M_allocated_capacity;
            }
            local_70 = pbVar5->_M_string_length;
            (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
            pbVar5->_M_string_length = 0;
            (pbVar5->field_2)._M_local_buf[0] = '\0';
            (*pEVar1->_vptr_Env[8])(&local_e0,pEVar1,&local_78);
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((local_c0 == (size_type *)0x0) && (local_e0 != (char *)0x0)) {
              if (local_e0 == (char *)0x0) {
                local_c0 = (size_type *)0x0;
              }
              else {
                local_c0 = (size_type *)Status::CopyState(local_e0);
              }
            }
            if (local_e0 != (char *)0x0) {
              operator_delete__(local_e0);
            }
          }
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar7 < (ulong)((long)local_b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      (*pEVar1->_vptr_Env[0xe])(&local_e8,pEVar1,local_c8);
      if (local_e8 != (void *)0x0) {
        operator_delete__(local_e8);
      }
      (*pEVar1->_vptr_Env[8])(&local_f0,pEVar1,&local_58);
      if (local_f0 != (void *)0x0) {
        operator_delete__(local_f0);
      }
      (*pEVar1->_vptr_Env[10])(&local_f8,pEVar1,dbname);
      if (local_f8 != (void *)0x0) {
        operator_delete__(local_f8);
      }
    }
    *(size_type **)this = local_c0;
    local_c0 = (size_type *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  if (local_c0 != (size_type *)0x0) {
    operator_delete__(local_c0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->DeleteFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->DeleteFile(lockname);
    env->DeleteDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}